

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall tinyusdz::Path::Path(Path *this,Path *rhs)

{
  Path *rhs_local;
  Path *this_local;
  
  ::std::__cxx11::string::string((string *)this,(string *)rhs);
  ::std::__cxx11::string::string((string *)&this->_prop_part,(string *)&rhs->_prop_part);
  ::std::__cxx11::string::string((string *)&this->_variant_part,(string *)&rhs->_variant_part);
  ::std::__cxx11::string::string
            ((string *)&this->_variant_selection_part,(string *)&rhs->_variant_selection_part);
  ::std::__cxx11::string::string
            ((string *)&this->_variant_part_str,(string *)&rhs->_variant_part_str);
  ::std::__cxx11::string::string((string *)&this->_element,(string *)&rhs->_element);
  nonstd::optional_lite::optional<tinyusdz::Path::PathType>::optional
            (&this->_path_type,&rhs->_path_type);
  this->_valid = (bool)(rhs->_valid & 1);
  return;
}

Assistant:

Path(const Path &rhs) = default;